

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTRuntimeInfoTracker.h
# Opt level: O2

void TTD::SortDictIntoListOnNames<Js::RecyclableObject*>
               (BaseDictionary<Js::RecyclableObject_*,_TTD::UtilSupport::TTAutoString_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                *objToNameMap,
               List<Js::RecyclableObject_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
               *sortedObjList,TTAutoString *nullString)

{
  int iVar1;
  Type *ppRVar2;
  TTAutoString *this;
  char16 *string1;
  char16 *string2;
  int index;
  int index_00;
  Type local_68;
  RecyclableObject *shiftElem;
  long local_58;
  Type local_50;
  RecyclableObject *temp;
  int local_3c;
  uint local_38;
  Type local_34;
  
  if ((sortedObjList->
      super_ReadOnlyList<Js::RecyclableObject_*,_Memory::HeapAllocator,_DefaultComparer>).count != 0
     ) {
    TTDAbort_unrecoverable_error("This should be empty.");
  }
  JsUtil::
  BaseDictionary<Js::RecyclableObject_*,_TTD::UtilSupport::TTAutoString_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::
  MapEntryUntil<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_chakra_core[P]ChakraCore_lib_Common_DataStructures_BaseDictionary_h:587:34)>
            (objToNameMap,(anon_class_8_1_3fcf6586)sortedObjList);
  local_34 = (sortedObjList->
             super_ReadOnlyList<Js::RecyclableObject_*,_Memory::HeapAllocator,_DefaultComparer>).
             count;
  local_58 = 0;
  do {
    if (local_58 == 8) {
      return;
    }
    local_38 = (&DAT_00f27870)[local_58];
    temp = (RecyclableObject *)(ulong)local_38;
    index_00 = 0;
    for (; (int)local_38 < local_34; local_38 = local_38 + 1) {
      ppRVar2 = JsUtil::
                List<Js::RecyclableObject_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                ::Item(sortedObjList,local_38);
      local_50 = *ppRVar2;
      shiftElem = (RecyclableObject *)
                  JsUtil::
                  BaseDictionary<Js::RecyclableObject_*,_TTD::UtilSupport::TTAutoString_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                  ::Item(objToNameMap,&local_50);
      local_3c = index_00;
      for (; index = (int)temp + index_00, (int)temp <= index; index_00 = index_00 - (int)temp) {
        ppRVar2 = JsUtil::
                  List<Js::RecyclableObject_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                  ::Item(sortedObjList,index_00);
        this = JsUtil::
               BaseDictionary<Js::RecyclableObject_*,_TTD::UtilSupport::TTAutoString_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
               ::Item(objToNameMap,ppRVar2);
        string1 = UtilSupport::TTAutoString::GetStrValue(this);
        string2 = UtilSupport::TTAutoString::GetStrValue((TTAutoString *)shiftElem);
        iVar1 = PAL_wcscmp(string1,string2);
        if (iVar1 < 1) break;
        ppRVar2 = JsUtil::
                  List<Js::RecyclableObject_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                  ::Item(sortedObjList,index_00);
        local_68 = *ppRVar2;
        JsUtil::
        List<Js::RecyclableObject_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
        ::SetItem(sortedObjList,index,&local_68);
      }
      JsUtil::
      List<Js::RecyclableObject_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
      ::SetItem(sortedObjList,index,&local_50);
      index_00 = local_3c + 1;
    }
    local_58 = local_58 + 1;
  } while( true );
}

Assistant:

void SortDictIntoListOnNames(const JsUtil::BaseDictionary<T, UtilSupport::TTAutoString*, HeapAllocator>& objToNameMap, JsUtil::List<T, HeapAllocator>& sortedObjList, const UtilSupport::TTAutoString& nullString)
    {
        TTDAssert(sortedObjList.Count() == 0, "This should be empty.");

        objToNameMap.Map([&](T key, UtilSupport::TTAutoString* value)
        {
            sortedObjList.Add(key);
        });

        //now sort the list so the traversal order is stable
        //Rock a custom shell sort!!!!
        const int32 gaps[8] = { 701, 301, 132, 57, 23, 10, 4, 1 };

        int32 llen = sortedObjList.Count();
        for(uint32 gapi = 0; gapi < 8; ++gapi)
        {
            int32 gap = gaps[gapi];

            for(int32 i = gap; i < llen; i++)
            {
                T temp = sortedObjList.Item(i);
                const UtilSupport::TTAutoString* tempStr = objToNameMap.Item(temp);

                int32 j = 0;
                for(j = i; j >= gap && (wcscmp(objToNameMap.Item(sortedObjList.Item(j - gap))->GetStrValue(), tempStr->GetStrValue()) > 0); j -= gap)
                {
                    T shiftElem = sortedObjList.Item(j - gap);
                    sortedObjList.SetItem(j, shiftElem);
                }

                sortedObjList.SetItem(j, temp);
            }
        }
    }